

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_new2(archive *a)

{
  archive_entry *entry;
  archive *a_local;
  
  a_local = (archive *)calloc(1,0x500);
  if (a_local == (archive *)0x0) {
    a_local = (archive *)0x0;
  }
  else {
    *(archive **)a_local = a;
    *(undefined4 *)((long)&a_local[8].read_data_remaining + 4) = 0;
  }
  return (archive_entry *)a_local;
}

Assistant:

struct archive_entry *
archive_entry_new2(struct archive *a)
{
	struct archive_entry *entry;

	entry = (struct archive_entry *)calloc(1, sizeof(*entry));
	if (entry == NULL)
		return (NULL);
	entry->archive = a;
	entry->ae_symlink_type = AE_SYMLINK_TYPE_UNDEFINED;
	return (entry);
}